

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

VertexData<Vertex> * __thiscall
geometrycentral::surface::SurfaceMesh::separateNonmanifoldVertices
          (VertexData<Vertex> *__return_storage_ptr__,SurfaceMesh *this)

{
  size_t sVar1;
  pointer pcVar2;
  pointer puVar3;
  Vertex *pVVar4;
  unsigned_long uVar5;
  ParentMeshT *pPVar6;
  bool bVar7;
  size_t sVar8;
  runtime_error *this_00;
  size_t sVar9;
  size_t i;
  size_t sVar10;
  Vertex VVar11;
  vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  vertexEntries;
  Edge e;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2;
  VertexData<bool> baseVertexUsed;
  DisjointSets djSet;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __end2_1;
  
  sVar1 = this->nHalfedgesFillCount;
  DisjointSets::DisjointSets(&djSet,sVar1);
  baseVertexUsed.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (bool *)this->nEdgesFillCount;
  baseVertexUsed.defaultValue = false;
  baseVertexUsed._9_7_ = 0;
  baseVertexUsed.mesh = this;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin
            ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)&vertexEntries,
             (RangeSetBase<geometrycentral::surface::EdgeRangeF> *)&baseVertexUsed);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end
            (&__end2,(RangeSetBase<geometrycentral::surface::EdgeRangeF> *)&baseVertexUsed);
  do {
    if (vertexEntries.
        super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)__end2.iCurr) {
      MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::MeshData
                (__return_storage_ptr__,this);
      baseVertexUsed.mesh = (ParentMeshT *)0x0;
      baseVertexUsed.defaultValue = true;
      baseVertexUsed._9_7_ = 0xffffffffffffff;
      ::std::
      vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>::
      vector(&vertexEntries,sVar1,(value_type *)&baseVertexUsed,(allocator_type *)&__end2);
      MeshData<geometrycentral::surface::Vertex,_bool>::MeshData(&baseVertexUsed,this,false);
      __end2.iEnd = this->nHalfedgesFillCount;
      __end2.iCurr = 0;
      __end2.mesh = this;
      RangeSetBase<geometrycentral::surface::CornerRangeF>::begin
                ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)&e,
                 (RangeSetBase<geometrycentral::surface::CornerRangeF> *)&__end2);
      RangeSetBase<geometrycentral::surface::CornerRangeF>::end
                (&__end2_1,(RangeSetBase<geometrycentral::surface::CornerRangeF> *)&__end2);
      while (sVar1 = e.
                     super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                     .ind,
            pPVar6 = e.
                     super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                     .mesh,
            e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
            ind != __end2_1.iCurr) {
        sVar8 = DisjointSets::find(&djSet,e.
                                          super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                                          .ind);
        if (vertexEntries.
            super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar8].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind == 0xffffffffffffffff) {
          sVar10 = (pPVar6->heVertexArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar1];
          if (baseVertexUsed.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.
              m_storage.m_data[sVar10] == true) {
            VVar11 = getNewVertex(this);
            sVar9 = VVar11.
                    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                    .ind;
            vertexEntries.
            super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar8].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh = VVar11.
                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                   .mesh;
            vertexEntries.
            super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar8].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind = sVar9;
            pVVar4 = (__return_storage_ptr__->data).
                     super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Vertex,__1,_1,_0,__1,_1>_>
                     .m_storage.m_data;
            pVVar4[sVar9].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh = pPVar6;
            pVVar4[sVar9].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind = sVar10;
          }
          else {
            pVVar4 = (__return_storage_ptr__->data).
                     super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Vertex,__1,_1,_0,__1,_1>_>
                     .m_storage.m_data;
            pVVar4[sVar10].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh = pPVar6;
            pVVar4[sVar10].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind = sVar10;
            vertexEntries.
            super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar8].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh = pPVar6;
            vertexEntries.
            super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar8].
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind = sVar10;
            baseVertexUsed.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.
            m_storage.m_data[sVar10] = true;
          }
        }
        uVar5 = vertexEntries.
                super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar8].
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .ind;
        (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[sVar1] = uVar5;
        (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar5] = sVar1;
        RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator++
                  ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)&e);
      }
      initializeHalfedgeNeighbors(this);
      this->modificationTick = this->modificationTick + 1;
      MeshData<geometrycentral::surface::Vertex,_bool>::~MeshData(&baseVertexUsed);
      ::std::
      _Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
      ::~_Vector_base(&vertexEntries.
                       super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                     );
      DisjointSets::~DisjointSets(&djSet);
      return __return_storage_ptr__;
    }
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)
         vertexEntries.
         super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
         ._M_impl.super__Vector_impl_data._M_start;
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)vertexEntries.
                 super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = Edge::isBoundary(&e);
    if (!bVar7) {
      bVar7 = Edge::isManifold(&e);
      pPVar6 = e.
               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
               mesh;
      if (!bVar7) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (this_00,"mesh must be edge-manifold for separateNonmanifoldVertices()");
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag == true) {
        sVar8 = e.
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                .ind * 2 + 1;
        sVar10 = e.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 .ind * 2;
      }
      else {
        pcVar2 = ((e.
                   super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .mesh)->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar10 = ((e.
                   super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .mesh)->eHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [e.
                  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .ind];
        sVar8 = ((e.
                  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heSiblingArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[sVar10];
        if ((pcVar2[sVar8] != '\0') == (pcVar2[sVar10] != '\0')) {
          DisjointSets::merge(&djSet,sVar10,sVar8);
          puVar3 = (pPVar6->heNextArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          DisjointSets::merge(&djSet,puVar3[sVar10],puVar3[sVar8]);
          goto LAB_00159b78;
        }
      }
      DisjointSets::merge(&djSet,((e.
                                   super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                                  .mesh)->heNextArr).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[sVar10],sVar8);
      DisjointSets::merge(&djSet,sVar10,
                          (pPVar6->heNextArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[sVar8]);
    }
LAB_00159b78:
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)&vertexEntries);
  } while( true );
}

Assistant:

VertexData<Vertex> SurfaceMesh::separateNonmanifoldVertices() {

  // Find edge-connected sets of corners
  size_t indMax = nHalfedgesFillCount;
  DisjointSets djSet(indMax);
  for (Edge e : edges()) {
    if (e.isBoundary()) continue;
    if (!e.isManifold()) {
      throw std::runtime_error("mesh must be edge-manifold for separateNonmanifoldVertices()");
    }
    Halfedge heA = e.halfedge();
    Halfedge heB = heA.sibling();

    if (heA.orientation() == heB.orientation()) {
      djSet.merge(heA.corner().getIndex(), heB.corner().getIndex());
      djSet.merge(heA.next().corner().getIndex(), heB.next().corner().getIndex());
    } else {
      djSet.merge(heA.next().corner().getIndex(), heB.corner().getIndex());
      djSet.merge(heA.corner().getIndex(), heB.next().corner().getIndex());
    }
  }

  // Make sure there is a distinct vertex entry for each component
  VertexData<Vertex> parents(*this);
  std::vector<Vertex> vertexEntries(indMax, Vertex());
  VertexData<bool> baseVertexUsed(*this, false);
  for (Corner c : corners()) {
    size_t iComp = djSet.find(c.getIndex());
    Vertex origV = c.vertex();

    // create vertex if needed
    if (vertexEntries[iComp] == Vertex()) {
      if (baseVertexUsed[origV]) {
        Vertex newV = getNewVertex();
        vertexEntries[iComp] = newV;
        parents[newV] = origV;
      } else {
        parents[origV] = origV;
        vertexEntries[iComp] = origV;
        baseVertexUsed[origV] = true;
      }
    }

    // hook up
    Vertex targetV = vertexEntries[iComp];
    Halfedge he = c.halfedge();
    heVertexArr[he.getIndex()] = targetV.getIndex();
    vHalfedgeArr[targetV.getIndex()] = he.getIndex();
  }

  // just rebuild these from scratch, rather than trying to maintain
  initializeHalfedgeNeighbors();

  modificationTick++;
  return parents;
}